

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invalid_locale_ctype_tests.cpp
# Opt level: O2

void __thiscall iu_Locale_x_iutest_x_Invalid_Test::Body(iu_Locale_x_iutest_x_Invalid_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  setlocale(0,"xxx");
  iutest::internal::NullHelper<false>::CompareEq<char>
            ((char *)iutest_ar.m_message._M_string_length,iutest_ar.m_message._M_dataplus._M_p);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_locale_ctype_tests.cpp"
               ,0x19,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::detail::IUStreamCapture::GetStreamString_abi_cxx11_
              ((string *)&local_190,(IUStreamCapture *)&stderr_capture);
    iuutil::StrInHelper::Assertion<char[35],std::__cxx11::string>
              (&iutest_ar,(StrInHelper *)"\"failed: setlocale LC_CTYPE to hoge\"",
               "stderr_capture.GetStreamString()","failed: setlocale LC_CTYPE to hoge",
               (char (*) [35])&local_190,in_R9);
    std::__cxx11::string::~string((string *)&local_190);
    if (iutest_ar.m_result != false) goto LAB_0011593c;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_locale_ctype_tests.cpp"
               ,0x1a,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_0011593c:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(Locale, Invalid)
{
    IUTEST_ASSUME_NULL(setlocale(LC_CTYPE, "xxx"));
    IUTEST_ASSERT_STRIN("failed: setlocale LC_CTYPE to hoge", stderr_capture.GetStreamString());
}